

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_image_t *poVar1;
  opj_simple_mcc_decorrelation_data_t *poVar2;
  opj_mct_data_t *poVar3;
  OPJ_UINT32 OVar4;
  opj_tcp_t *poVar5;
  OPJ_FLOAT32 *pOVar6;
  void *ptr;
  OPJ_UINT32 OVar7;
  OPJ_INT32 *pOVar8;
  char *fmt;
  long lVar9;
  OPJ_BOOL OVar10;
  opj_j2k_t *poVar11;
  OPJ_INT32 event_type;
  uint uVar12;
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 l_tmp;
  uint local_54;
  opj_tcp_t *local_50;
  opj_j2k_t *local_48;
  OPJ_UINT32 local_3c;
  opj_image_t *local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e1,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e2,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e3,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar5 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar5 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size == 0) {
    fmt = "Error reading MCO marker\n";
    OVar10 = 0;
    event_type = 1;
  }
  else {
    poVar1 = p_j2k->m_private_image;
    OVar10 = 1;
    local_50 = poVar5;
    local_48 = p_j2k;
    opj_read_bytes_LE(p_header_data,&local_54,1);
    poVar11 = local_48;
    poVar5 = local_50;
    if (local_54 < 2) {
      if (local_54 + 1 == p_header_size) {
        OVar4 = poVar1->numcomps;
        if (OVar4 != 0) {
          pOVar8 = &local_50->tccps->m_dc_level_shift;
          do {
            *pOVar8 = 0;
            pOVar8 = pOVar8 + 0x10e;
            OVar4 = OVar4 - 1;
          } while (OVar4 != 0);
        }
        if (local_50->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
          opj_free(local_50->m_mct_decoding_matrix);
          poVar5->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
        }
        if (local_54 != 0) {
          uVar12 = 0;
          do {
            p_header_data = p_header_data + 1;
            opj_read_bytes_LE(p_header_data,&local_3c,1);
            if (poVar5 == (opj_tcp_t *)0x0) {
              __assert_fail("p_tcp != 00",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                            ,0x1922,
                            "OPJ_BOOL opj_j2k_add_mct(opj_tcp_t *, opj_image_t *, OPJ_UINT32)");
            }
            poVar2 = poVar5->m_mcc_records;
            OVar4 = poVar5->m_nb_mcc_records;
            if (OVar4 == 0) {
              OVar7 = 0;
            }
            else {
              OVar7 = OVar4;
              if (poVar2->m_index == local_3c) {
                OVar7 = 0;
              }
            }
            if (OVar7 != OVar4) {
              poVar1 = poVar11->m_private_image;
              OVar4 = poVar1->numcomps;
              if (poVar2->m_nb_comps == OVar4) {
                poVar3 = poVar2->m_decorrelation_array;
                local_38 = poVar1;
                if (poVar3 != (opj_mct_data_t *)0x0) {
                  OVar4 = OVar4 * OVar4;
                  if (poVar3->m_data_size != MCT_ELEMENT_SIZE[poVar3->m_element_type] * OVar4) {
                    return 0;
                  }
                  pOVar6 = (OPJ_FLOAT32 *)opj_malloc((ulong)(OVar4 * 4));
                  local_50->m_mct_decoding_matrix = pOVar6;
                  if (pOVar6 == (OPJ_FLOAT32 *)0x0) {
                    return 0;
                  }
                  (*j2k_mct_read_functions_to_float[poVar3->m_element_type])
                            (poVar3->m_data,pOVar6,OVar4);
                  poVar11 = local_48;
                }
                poVar3 = poVar2->m_offset_array;
                if (poVar3 != (opj_mct_data_t *)0x0) {
                  OVar4 = local_38->numcomps;
                  if (poVar3->m_data_size != MCT_ELEMENT_SIZE[poVar3->m_element_type] * OVar4) {
                    return 0;
                  }
                  ptr = opj_malloc((ulong)(OVar4 * 4));
                  if (ptr == (void *)0x0) {
                    return 0;
                  }
                  (*j2k_mct_read_functions_to_int32[poVar3->m_element_type])
                            (poVar3->m_data,ptr,OVar4);
                  OVar4 = local_38->numcomps;
                  if (OVar4 != 0) {
                    pOVar8 = &local_50->tccps->m_dc_level_shift;
                    lVar9 = 0;
                    do {
                      *pOVar8 = *(OPJ_INT32 *)((long)ptr + lVar9 * 4);
                      pOVar8 = pOVar8 + 0x10e;
                      lVar9 = lVar9 + 1;
                    } while (OVar4 != (OPJ_UINT32)lVar9);
                  }
                  opj_free(ptr);
                  poVar11 = local_48;
                }
              }
            }
            uVar12 = uVar12 + 1;
            poVar5 = local_50;
          } while (uVar12 < local_54);
        }
        return 1;
      }
      fmt = "Error reading MCO marker\n";
      OVar10 = 0;
    }
    else {
      fmt = "Cannot take in charge multiple transformation stages.\n";
    }
    event_type = 2;
  }
  opj_event_msg(p_manager,event_type,fmt);
  return OVar10;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_tmp, i;
    OPJ_UINT32 l_nb_stages;
    opj_tcp_t * l_tcp;
    opj_tccp_t * l_tccp;
    opj_image_t * l_image;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCO marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_nb_stages,
                   1);                         /* Nmco : only one transform stage*/
    ++p_header_data;

    if (l_nb_stages > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple transformation stages.\n");
        return OPJ_TRUE;
    }

    if (p_header_size != l_nb_stages + 1) {
        opj_event_msg(p_manager, EVT_WARNING, "Error reading MCO marker\n");
        return OPJ_FALSE;
    }

    l_tccp = l_tcp->tccps;

    for (i = 0; i < l_image->numcomps; ++i) {
        l_tccp->m_dc_level_shift = 0;
        ++l_tccp;
    }

    if (l_tcp->m_mct_decoding_matrix) {
        opj_free(l_tcp->m_mct_decoding_matrix);
        l_tcp->m_mct_decoding_matrix = 00;
    }

    for (i = 0; i < l_nb_stages; ++i) {
        opj_read_bytes(p_header_data, &l_tmp, 1);
        ++p_header_data;

        if (! opj_j2k_add_mct(l_tcp, p_j2k->m_private_image, l_tmp)) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}